

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcolr.c
# Opt level: O2

FT_Bool tt_face_get_color_glyph_clipbox(TT_Face face,FT_UInt base_glyph,FT_ClipBox *clip_box)

{
  Colr *colr;
  FT_Byte *pFVar1;
  void *pvVar2;
  ulong uVar3;
  FT_Size pFVar4;
  uint uVar5;
  long lVar6;
  byte *pbVar7;
  long lVar8;
  long lVar9;
  FT_Face_Internal matrix;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  FT_Vector corners [4];
  
  colr = (Colr *)face->colr;
  if (colr != (Colr *)0x0) {
    pFVar1 = colr->clip_list;
    if (pFVar1 != (FT_Byte *)0x0) {
      pvVar2 = colr->table;
      uVar3 = colr->table_size;
      if ((pFVar1 <= (FT_Byte *)((long)pvVar2 + (uVar3 - 5))) && (*pFVar1 == '\x01')) {
        uVar5 = *(uint *)(pFVar1 + 1);
        uVar11 = (ulong)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                        uVar5 << 0x18);
        if (uVar3 / 7 < uVar11) {
          return '\0';
        }
        if ((FT_Byte *)((long)pvVar2 + uVar11 * -7 + uVar3) < pFVar1 + 5) {
          return '\0';
        }
        for (lVar6 = 0; uVar11 * 7 - lVar6 != 0; lVar6 = lVar6 + 7) {
          if (((ushort)(*(ushort *)(pFVar1 + lVar6 + 5) << 8 | *(ushort *)(pFVar1 + lVar6 + 5) >> 8)
               <= base_glyph) &&
             (base_glyph <=
              (ushort)(*(ushort *)(pFVar1 + lVar6 + 7) << 8 | *(ushort *)(pFVar1 + lVar6 + 7) >> 8))
             ) {
            pbVar7 = pFVar1 + ((ulong)pFVar1[lVar6 + 0xb] |
                              (ulong)((uint)pFVar1[lVar6 + 10] << 8 |
                                     (uint)pFVar1[lVar6 + 9] << 0x10));
            if ((byte *)((long)pvVar2 + (uVar3 - 1)) < pbVar7) {
              return '\0';
            }
            if (pbVar7 + 1 <= (byte *)((long)pvVar2 + (uVar3 - 8)) && *pbVar7 < 3) {
              pFVar4 = (face->root).size;
              lVar6 = (long)(int)(pFVar4->metrics).x_scale;
              lVar12 = ((long)(short)((ushort)pbVar7[1] << 8) | (ulong)pbVar7[2]) * lVar6;
              lVar13 = lVar12 + 0x8000 + (lVar12 >> 0x3f) >> 0x10;
              lVar12 = (long)(int)(pFVar4->metrics).y_scale;
              lVar14 = ((long)(short)((ushort)pbVar7[3] << 8) | (ulong)pbVar7[4]) * lVar12;
              lVar14 = lVar14 + 0x8000 + (lVar14 >> 0x3f) >> 0x10;
              lVar6 = ((long)(short)((ushort)pbVar7[5] << 8) | (ulong)pbVar7[6]) * lVar6;
              lVar6 = lVar6 + 0x8000 + (lVar6 >> 0x3f) >> 0x10;
              lVar12 = ((long)(short)((ushort)pbVar7[7] << 8) | (ulong)pbVar7[8]) * lVar12;
              lVar12 = lVar12 + 0x8000 + (lVar12 >> 0x3f) >> 0x10;
              if (*pbVar7 == 2) {
                corners[0].x = 0;
                corners[0].y = 0;
                if ((byte *)((long)pvVar2 + (uVar3 - 4)) < pbVar7 + 9) {
                  return '\0';
                }
                uVar5 = *(uint *)(pbVar7 + 9);
                get_deltas_for_var_index_base
                          (face,colr,
                           (ulong)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                                  uVar5 << 0x18),4,(FT_ItemVarDelta *)corners);
                pFVar4 = (face->root).size;
                lVar8 = (long)(int)(pFVar4->metrics).x_scale;
                lVar9 = (int)corners[0].x * lVar8;
                lVar13 = lVar13 + (int)((ulong)(lVar9 + 0x8000 + (lVar9 >> 0x3f)) >> 0x10);
                lVar9 = (long)(int)(pFVar4->metrics).y_scale;
                lVar10 = corners[0].x._4_4_ * lVar9;
                lVar14 = lVar14 + (int)((ulong)(lVar10 + 0x8000 + (lVar10 >> 0x3f)) >> 0x10);
                lVar8 = (int)corners[0].y * lVar8;
                lVar6 = lVar6 + (int)((ulong)(lVar8 + 0x8000 + (lVar8 >> 0x3f)) >> 0x10);
                lVar9 = corners[0].y._4_4_ * lVar9;
                lVar12 = lVar12 + (int)((ulong)(lVar9 + 0x8000 + (lVar9 >> 0x3f)) >> 0x10);
              }
              corners[1].x = lVar13;
              corners[2].x = lVar6;
              corners[3].x = lVar6;
              corners[0].y = lVar14;
              corners[0].x = lVar13;
              corners[1].y = lVar12;
              corners[2].y = lVar12;
              corners[3].y = lVar14;
              for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 0x10) {
                matrix = (face->root).internal;
                uVar5 = matrix->transform_flags;
                if ((uVar5 & 1) != 0) {
                  FT_Vector_Transform((FT_Vector *)((long)&corners[0].x + lVar6),
                                      &matrix->transform_matrix);
                  matrix = (face->root).internal;
                  uVar5 = matrix->transform_flags;
                }
                if ((uVar5 & 2) != 0) {
                  lVar12 = (matrix->transform_delta).y;
                  *(FT_Pos *)((long)&corners[0].x + lVar6) =
                       (matrix->transform_delta).x + *(long *)((long)&corners[0].x + lVar6);
                  *(long *)((long)&corners[0].y + lVar6) =
                       lVar12 + *(long *)((long)&corners[0].y + lVar6);
                }
              }
              (clip_box->bottom_left).x = corners[0].x;
              (clip_box->bottom_left).y = corners[0].y;
              (clip_box->top_left).x = corners[1].x;
              (clip_box->top_left).y = corners[1].y;
              (clip_box->top_right).x = corners[2].x;
              (clip_box->top_right).y = corners[2].y;
              (clip_box->bottom_right).x = corners[3].x;
              (clip_box->bottom_right).y = corners[3].y;
              return '\x01';
            }
            return '\0';
          }
        }
      }
    }
  }
  return '\0';
}

Assistant:

FT_LOCAL_DEF( FT_Bool )
  tt_face_get_color_glyph_clipbox( TT_Face      face,
                                   FT_UInt      base_glyph,
                                   FT_ClipBox*  clip_box )
  {
    Colr*  colr;

    FT_Byte  *p, *p1, *clip_base, *limit;

    FT_Byte    clip_list_format;
    FT_ULong   num_clip_boxes, i;
    FT_UShort  gid_start, gid_end;
    FT_UInt32  clip_box_offset;
    FT_Byte    format;

    const FT_Byte  num_corners = 4;
    FT_Vector      corners[4];
    FT_Byte        j;
    FT_BBox        font_clip_box;


    colr = (Colr*)face->colr;
    if ( !colr )
      return 0;

    if ( !colr->clip_list )
      return 0;

    p = colr->clip_list;

    /* Limit points to the first byte after the end of the color table.    */
    /* Thus, in subsequent limit checks below we need to check whether the */
    /* read pointer is strictly greater than a position offset by certain  */
    /* field sizes to the left of that position.                           */
    limit = (FT_Byte*)colr->table + colr->table_size;

    /* Check whether we can extract one `uint8` and one `uint32`. */
    if ( p > limit - ( 1 + 4 ) )
      return 0;

    clip_base        = p;
    clip_list_format = FT_NEXT_BYTE ( p );

    /* Format byte used here to be able to upgrade ClipList for >16bit */
    /* glyph ids; for now we can expect it to be 1.                    */
    if ( !( clip_list_format == 1 ) )
      return 0;

    num_clip_boxes = FT_NEXT_ULONG( p );

    /* Check whether we can extract two `uint16` and one `Offset24`, */
    /* `num_clip_boxes` times.                                       */
    if ( colr->table_size / ( 2 + 2 + 3 ) < num_clip_boxes ||
         p > limit - ( 2 + 2 + 3 ) * num_clip_boxes        )
      return 0;

    for ( i = 0; i < num_clip_boxes; ++i )
    {
      gid_start       = FT_NEXT_USHORT( p );
      gid_end         = FT_NEXT_USHORT( p );
      clip_box_offset = FT_NEXT_UOFF3( p );

      if ( base_glyph >= gid_start && base_glyph <= gid_end )
      {
        p1 = (FT_Byte*)( clip_base + clip_box_offset );

        /* Check whether we can extract one `uint8`. */
        if ( p1 > limit - 1 )
          return 0;

        format = FT_NEXT_BYTE( p1 );

        if ( format > 2 )
          return 0;

        /* Check whether we can extract four `FWORD`. */
        if ( p1 > limit - ( 2 + 2 + 2 + 2 ) )
          return 0;

        /* `face->root.size->metrics.x_scale` and `y_scale` are factors   */
        /* that scale a font unit value in integers to a 26.6 fixed value */
        /* according to the requested size, see for example               */
        /* `ft_recompute_scaled_metrics`.                                 */
        font_clip_box.xMin = FT_MulFix( FT_NEXT_SHORT( p1 ),
                                        face->root.size->metrics.x_scale );
        font_clip_box.yMin = FT_MulFix( FT_NEXT_SHORT( p1 ),
                                        face->root.size->metrics.y_scale );
        font_clip_box.xMax = FT_MulFix( FT_NEXT_SHORT( p1 ),
                                        face->root.size->metrics.x_scale );
        font_clip_box.yMax = FT_MulFix( FT_NEXT_SHORT( p1 ),
                                        face->root.size->metrics.y_scale );

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
        if ( format == 2 )
        {
          FT_ULong         var_index_base = 0;
          /* varIndexBase offset for clipbox is 3 at most. */
          FT_ItemVarDelta  item_deltas[4] = { 0, 0, 0, 0 };


          /* Check whether we can extract a 32-bit varIndexBase now. */
          if ( p1 > limit - 4 )
            return 0;

          var_index_base = FT_NEXT_ULONG( p1 );

          if ( !get_deltas_for_var_index_base( face, colr, var_index_base, 4,
                                               item_deltas ) )
            return 0;

          font_clip_box.xMin +=
            FT_MulFix( item_deltas[0], face->root.size->metrics.x_scale );
          font_clip_box.yMin +=
            FT_MulFix( item_deltas[1], face->root.size->metrics.y_scale );
          font_clip_box.xMax +=
            FT_MulFix( item_deltas[2], face->root.size->metrics.x_scale );
          font_clip_box.yMax +=
            FT_MulFix( item_deltas[3], face->root.size->metrics.y_scale );
        }
#endif

        /* Make 4 corner points (xMin, yMin), (xMax, yMax) and transform */
        /* them.  If we we would only transform two corner points and    */
        /* span a rectangle based on those, the rectangle may become too */
        /* small to cover the glyph.                                     */
        corners[0].x = font_clip_box.xMin;
        corners[1].x = font_clip_box.xMin;
        corners[2].x = font_clip_box.xMax;
        corners[3].x = font_clip_box.xMax;

        corners[0].y = font_clip_box.yMin;
        corners[1].y = font_clip_box.yMax;
        corners[2].y = font_clip_box.yMax;
        corners[3].y = font_clip_box.yMin;

        for ( j = 0; j < num_corners; ++j )
        {
          if ( face->root.internal->transform_flags & 1 )
            FT_Vector_Transform( &corners[j],
                                 &face->root.internal->transform_matrix );

          if ( face->root.internal->transform_flags & 2 )
          {
            corners[j].x += face->root.internal->transform_delta.x;
            corners[j].y += face->root.internal->transform_delta.y;
          }
        }

        clip_box->bottom_left  = corners[0];
        clip_box->top_left     = corners[1];
        clip_box->top_right    = corners[2];
        clip_box->bottom_right = corners[3];

        return 1;
      }
    }

    return 0;
  }